

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int loadfunc(lua_State *L,char *filename,char *modname)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = luaL_gsub(L,modname,".","_");
  pcVar3 = strchr(pcVar2,0x2d);
  if (pcVar3 != (char *)0x0) {
    pcVar2 = lua_pushlstring(L,pcVar2,(long)pcVar3 - (long)pcVar2);
    pcVar2 = lua_pushfstring(L,"luaopen_%s",pcVar2);
    iVar1 = lookforfunc(L,filename,pcVar2);
    if (iVar1 != 2) {
      return iVar1;
    }
    pcVar2 = pcVar3 + 1;
  }
  pcVar2 = lua_pushfstring(L,"luaopen_%s",pcVar2);
  iVar1 = lookforfunc(L,filename,pcVar2);
  return iVar1;
}

Assistant:

static int loadfunc(lua_State *L, const char *filename, const char *modname) {
    const char *openfunc;
    const char *mark;
    modname = luaL_gsub(L, modname, ".", LUA_OFSEP);
    mark = strchr(modname, *LUA_IGMARK);
    if (mark) {
        int stat;
        openfunc = lua_pushlstring(L, modname, mark - modname);
        openfunc = lua_pushfstring(L, LUA_POF"%s", openfunc);
        stat = lookforfunc(L, filename, openfunc);
        if (stat != ERRFUNC) return stat;
        modname = mark + 1;  /* else go ahead and try old-style name */
    }
    openfunc = lua_pushfstring(L, LUA_POF"%s", modname);
    return lookforfunc(L, filename, openfunc);
}